

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

CreateSignatureHashRequestStruct * __thiscall
cfd::js::api::json::CreateSignatureHashRequest::ConvertToStruct
          (CreateSignatureHashRequestStruct *__return_storage_ptr__,CreateSignatureHashRequest *this
          )

{
  CreateSignatureHashTxInRequestStruct local_148;
  undefined1 local_19;
  CreateSignatureHashRequest *local_18;
  CreateSignatureHashRequest *this_local;
  CreateSignatureHashRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CreateSignatureHashRequest *)__return_storage_ptr__;
  CreateSignatureHashRequestStruct::CreateSignatureHashRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->tx_);
  CreateSignatureHashTxInRequest::ConvertToStruct(&local_148,&this->txin_);
  CreateSignatureHashTxInRequestStruct::operator=(&__return_storage_ptr__->txin,&local_148);
  CreateSignatureHashTxInRequestStruct::~CreateSignatureHashTxInRequestStruct(&local_148);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

CreateSignatureHashRequestStruct CreateSignatureHashRequest::ConvertToStruct() const {  // NOLINT
  CreateSignatureHashRequestStruct result;
  result.tx = tx_;
  result.txin = txin_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}